

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  vfloat<4> vVar3;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  byte bVar23;
  long lVar24;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar25;
  size_t sVar26;
  size_t sVar27;
  uint uVar28;
  NodeRef root;
  long lVar29;
  byte bVar30;
  undefined4 uVar31;
  NodeRef *pNVar32;
  byte bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_2;
  float fVar50;
  float fVar51;
  float fVar52;
  vint4 bi;
  float fVar53;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar54 [16];
  vint4 ai;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_2;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_3;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar75 [64];
  uint local_380c;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_3778 [16];
  BVH *local_3760;
  Intersectors *local_3758;
  long local_3750;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3748;
  undefined1 local_3738 [16];
  undefined1 local_3728 [16];
  undefined1 local_3718 [16];
  undefined1 local_3708 [8];
  float fStack_3700;
  float fStack_36fc;
  undefined1 local_36f8 [8];
  float fStack_36f0;
  float fStack_36ec;
  undefined1 local_36e8 [8];
  float fStack_36e0;
  float fStack_36dc;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3598;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined1 local_3558 [8];
  float fStack_3550;
  float fStack_354c;
  undefined1 local_3548 [8];
  float fStack_3540;
  float fStack_353c;
  undefined1 local_3538 [16];
  uint local_3528;
  uint uStack_3524;
  uint uStack_3520;
  uint uStack_351c;
  uint uStack_3518;
  uint uStack_3514;
  uint uStack_3510;
  uint uStack_350c;
  Vec3vf<4> Ng;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  local_3760 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_3760->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar39 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar47 = ZEXT816(0) << 0x40;
    uVar8 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47,5);
    uVar34 = vpcmpeqd_avx512vl(auVar39,(undefined1  [16])valid_i->field_0);
    uVar34 = ((byte)uVar8 & 0xf) & uVar34;
    bVar33 = (byte)uVar34;
    if (bVar33 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx(auVar41,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      uVar9 = vcmpps_avx512vl(auVar39,auVar37,1);
      bVar19 = (bool)((byte)uVar9 & 1);
      auVar38._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._0_4_;
      bVar19 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._4_4_;
      bVar19 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._8_4_;
      bVar19 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._12_4_;
      auVar39 = vandps_avx(auVar41,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar9 = vcmpps_avx512vl(auVar39,auVar37,1);
      bVar19 = (bool)((byte)uVar9 & 1);
      auVar35._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._16_4_;
      bVar19 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._20_4_;
      bVar19 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._24_4_;
      bVar19 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._28_4_;
      auVar39 = vandps_avx(auVar41,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar9 = vcmpps_avx512vl(auVar39,auVar37,1);
      bVar19 = (bool)((byte)uVar9 & 1);
      auVar36._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._32_4_;
      bVar19 = (bool)((byte)(uVar9 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._36_4_;
      bVar19 = (bool)((byte)(uVar9 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._40_4_;
      bVar19 = (bool)((byte)(uVar9 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * tray.dir.field_0._44_4_;
      auVar37 = vrcp14ps_avx512vl(auVar38);
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar39 = vfnmadd213ps_fma(auVar38,auVar37,auVar40);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar39,auVar37,auVar37)
      ;
      auVar38 = vrcp14ps_avx512vl(auVar35);
      auVar39 = vfnmadd213ps_fma(auVar35,auVar38,auVar40);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar39,auVar38,auVar38)
      ;
      auVar38 = vrcp14ps_avx512vl(auVar36);
      auVar39 = vfnmadd213ps_fma(auVar36,auVar38,auVar40);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar39,auVar38,auVar38)
      ;
      uVar9 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar47,1);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar39._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar9 & 1) * auVar39._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar39._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar39._12_4_;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar9 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar47,5);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar19 = (bool)((byte)uVar9 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar19 * auVar39._0_4_ | (uint)!bVar19 * 0x60;
      bVar19 = (bool)((byte)(uVar9 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * 0x60;
      bVar19 = (bool)((byte)(uVar9 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * 0x60;
      bVar19 = (bool)((byte)(uVar9 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * 0x60;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      uVar9 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar47,5);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar19 = (bool)((byte)uVar9 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar19 * auVar39._0_4_ | (uint)!bVar19 * 0xa0;
      bVar19 = (bool)((byte)(uVar9 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * 0xa0;
      bVar19 = (bool)((byte)(uVar9 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * 0xa0;
      bVar19 = (bool)((byte)(uVar9 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * 0xa0;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar73 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar47);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar33 & 1) * auVar39._0_4_ |
           (uint)!(bool)(bVar33 & 1) * stack_near[0].field_0._0_4_;
      bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * stack_near[0].field_0._4_4_;
      bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * stack_near[0].field_0._8_4_;
      bVar19 = SUB81(uVar34 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * stack_near[0].field_0._12_4_;
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47);
      tray.tfar.field_0.i[0] =
           (uint)(bVar33 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar33 & 1) * -0x800000;
      bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * -0x800000;
      bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * -0x800000;
      bVar19 = SUB81(uVar34 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_380c = (byte)((ushort)((short)uVar34 << 0xc) >> 0xc) ^ 0xf;
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar25 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar74 = ZEXT1664(auVar39);
      auVar39 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar75 = ZEXT1664(auVar39);
      local_3758 = This;
LAB_01d6d43d:
      do {
        do {
          root.ptr = pNVar32[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d6ddc7;
          pNVar32 = pNVar32 + -1;
          paVar25 = paVar25 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar25->v;
          auVar68 = ZEXT1664((undefined1  [16])vVar3.field_0);
          uVar34 = vcmpps_avx512vl((undefined1  [16])vVar3.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar34 == '\0');
        uVar31 = (undefined4)uVar34;
        if (uVar28 < (uint)POPCOUNT(uVar31)) {
LAB_01d6d47d:
          do {
            iVar21 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d6ddc7;
              uVar8 = vcmpps_avx512vl(auVar68._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar8 == '\0') goto LAB_01d6d43d;
              local_3750 = (ulong)((uint)root.ptr & 0xf) - 8;
              bVar23 = ~(byte)local_380c & 0xf;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              lVar22 = 0;
              goto LAB_01d6d736;
            }
            sVar27 = 8;
            auVar39 = auVar73._0_16_;
            for (lVar22 = 0;
                (auVar68 = ZEXT1664(auVar39), lVar22 != 8 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar22 * 8), sVar4 != 8));
                lVar22 = lVar22 + 1) {
              auVar17._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar17._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar17._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar17._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0x40 + lVar22 * 4);
              auVar55._4_4_ = uVar31;
              auVar55._0_4_ = uVar31;
              auVar55._8_4_ = uVar31;
              auVar55._12_4_ = uVar31;
              auVar35 = vfmsub132ps_fma(auVar55,auVar17,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar31 = *(undefined4 *)(root.ptr + 0x80 + lVar22 * 4);
              auVar60._4_4_ = uVar31;
              auVar60._0_4_ = uVar31;
              auVar60._8_4_ = uVar31;
              auVar60._12_4_ = uVar31;
              auVar18._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar18._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar18._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar18._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar31 = *(undefined4 *)(root.ptr + 0xc0 + lVar22 * 4);
              auVar64._4_4_ = uVar31;
              auVar64._0_4_ = uVar31;
              auVar64._8_4_ = uVar31;
              auVar64._12_4_ = uVar31;
              auVar36 = vfmsub132ps_fma(auVar60,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar37 = vfmsub132ps_fma(auVar64,auVar18,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar31 = *(undefined4 *)(root.ptr + 0x60 + lVar22 * 4);
              auVar12._4_4_ = uVar31;
              auVar12._0_4_ = uVar31;
              auVar12._8_4_ = uVar31;
              auVar12._12_4_ = uVar31;
              auVar40 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar17,
                                   auVar12);
              uVar31 = *(undefined4 *)(root.ptr + 0xa0 + lVar22 * 4);
              auVar13._4_4_ = uVar31;
              auVar13._0_4_ = uVar31;
              auVar13._8_4_ = uVar31;
              auVar13._12_4_ = uVar31;
              auVar41 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar13
                                  );
              uVar31 = *(undefined4 *)(root.ptr + 0xe0 + lVar22 * 4);
              auVar14._4_4_ = uVar31;
              auVar14._0_4_ = uVar31;
              auVar14._8_4_ = uVar31;
              auVar14._12_4_ = uVar31;
              auVar42 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar18,
                                   auVar14);
              auVar47 = vpminsd_avx(auVar35,auVar40);
              auVar38 = vpminsd_avx(auVar36,auVar41);
              auVar47 = vpmaxsd_avx(auVar47,auVar38);
              auVar38 = vpminsd_avx(auVar37,auVar42);
              auVar47 = vpmaxsd_avx(auVar47,auVar38);
              auVar38 = vpmaxsd_avx(auVar35,auVar40);
              auVar35 = vpmaxsd_avx(auVar36,auVar41);
              auVar35 = vpminsd_avx(auVar38,auVar35);
              auVar38 = vpmaxsd_avx(auVar37,auVar42);
              auVar35 = vpminsd_avx(auVar35,auVar38);
              auVar38 = vpmaxsd_avx(auVar47,(undefined1  [16])tray.tnear.field_0);
              auVar35 = vpminsd_avx(auVar35,(undefined1  [16])tray.tfar.field_0);
              uVar34 = vpcmpd_avx512vl(auVar38,auVar35,2);
              uVar34 = uVar34 & 0xf;
              sVar26 = sVar27;
              auVar43 = auVar39;
              if ((byte)uVar34 != 0) {
                auVar38 = vblendmps_avx512vl(auVar73._0_16_,auVar47);
                bVar19 = (bool)((byte)uVar34 & 1);
                auVar43._0_4_ = (uint)bVar19 * auVar38._0_4_ | (uint)!bVar19 * auVar47._0_4_;
                bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar19 * auVar38._4_4_ | (uint)!bVar19 * auVar47._4_4_;
                bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar19 * auVar38._8_4_ | (uint)!bVar19 * auVar47._8_4_;
                bVar19 = SUB81(uVar34 >> 3,0);
                auVar43._12_4_ = (uint)bVar19 * auVar38._12_4_ | (uint)!bVar19 * auVar47._12_4_;
                sVar26 = sVar4;
                if (sVar27 != 8) {
                  pNVar32->ptr = sVar27;
                  pNVar32 = pNVar32 + 1;
                  *(undefined1 (*) [16])paVar25->v = auVar39;
                  paVar25 = paVar25 + 1;
                }
              }
              auVar39 = auVar43;
              sVar27 = sVar26;
            }
            if (sVar27 == 8) goto LAB_01d6d5e6;
            uVar8 = vcmpps_avx512vl(auVar39,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar27;
          } while ((byte)uVar28 < (byte)POPCOUNT((int)uVar8));
          pNVar32->ptr = sVar27;
          pNVar32 = pNVar32 + 1;
          *(undefined1 (*) [16])paVar25->v = auVar39;
          paVar25 = paVar25 + 1;
        }
        else {
          while( true ) {
            auVar39 = auVar75._0_16_;
            if (uVar34 == 0) break;
            sVar27 = 0;
            for (uVar9 = uVar34; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            bVar19 = occluded1(local_3758,local_3760,root,sVar27,&pre,ray,&tray,context);
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            auVar75 = ZEXT1664(auVar39);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar74 = ZEXT1664(auVar39);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar73 = ZEXT1664(auVar39);
            bVar23 = (byte)(1 << ((uint)sVar27 & 0x1f));
            if (!bVar19) {
              bVar23 = 0;
            }
            local_380c = (uint)((byte)local_380c | bVar23);
          }
          iVar21 = 3;
          auVar68 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if ((byte)local_380c != 0xf) {
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_380c & 1) * auVar39._0_4_ |
                 (uint)!(bool)((byte)local_380c & 1) * tray.tfar.field_0.i[0];
            bVar19 = (bool)((byte)(local_380c >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * tray.tfar.field_0.i[1];
            bVar19 = (bool)((byte)(local_380c >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * tray.tfar.field_0.i[2];
            bVar19 = (bool)((byte)(local_380c >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * tray.tfar.field_0.i[3];
            iVar21 = 2;
          }
          if (uVar28 < (uint)POPCOUNT(uVar31)) goto LAB_01d6d47d;
        }
LAB_01d6d5e6:
      } while ((iVar21 == 4) || (iVar21 == 2));
LAB_01d6ddc7:
      local_380c._0_1_ = (byte)local_380c & bVar33;
      bVar19 = (bool)((byte)local_380c >> 1 & 1);
      bVar7 = (bool)((byte)local_380c >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)((byte)local_380c & 1) * -0x800000 |
           (uint)!(bool)((byte)local_380c & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_380c >> 3) * -0x800000 |
           (uint)!(bool)((byte)local_380c >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
LAB_01d6d736:
  do {
    lVar24 = -0x10;
    bVar30 = bVar23;
    if (lVar22 == local_3750) goto LAB_01d6dd8a;
    do {
      if ((lVar24 == 0) || ((ulong)*(uint *)(lVar29 + lVar24) == 0xffffffff)) goto LAB_01d6dd71;
      uVar31 = *(undefined4 *)(lVar29 + -0x90 + lVar24);
      auVar46._4_4_ = uVar31;
      auVar46._0_4_ = uVar31;
      auVar46._8_4_ = uVar31;
      auVar46._12_4_ = uVar31;
      uVar31 = *(undefined4 *)(lVar29 + -0x80 + lVar24);
      auVar56._4_4_ = uVar31;
      auVar56._0_4_ = uVar31;
      auVar56._8_4_ = uVar31;
      auVar56._12_4_ = uVar31;
      uVar31 = *(undefined4 *)(lVar29 + -0x70 + lVar24);
      auVar58._4_4_ = uVar31;
      auVar58._0_4_ = uVar31;
      auVar58._8_4_ = uVar31;
      auVar58._12_4_ = uVar31;
      fVar50 = *(float *)(lVar29 + -0x60 + lVar24);
      auVar62._4_4_ = fVar50;
      auVar62._0_4_ = fVar50;
      auVar62._8_4_ = fVar50;
      auVar62._12_4_ = fVar50;
      uVar31 = *(undefined4 *)(lVar29 + -0x50 + lVar24);
      auVar67._4_4_ = uVar31;
      auVar67._0_4_ = uVar31;
      auVar67._8_4_ = uVar31;
      auVar67._12_4_ = uVar31;
      fVar51 = *(float *)(lVar29 + -0x40 + lVar24);
      auVar45._4_4_ = fVar51;
      auVar45._0_4_ = fVar51;
      auVar45._8_4_ = fVar51;
      auVar45._12_4_ = fVar51;
      fVar52 = *(float *)(lVar29 + -0x30 + lVar24);
      auVar61._4_4_ = fVar52;
      auVar61._0_4_ = fVar52;
      auVar61._8_4_ = fVar52;
      auVar61._12_4_ = fVar52;
      fVar53 = *(float *)(lVar29 + -0x20 + lVar24);
      auVar72._4_4_ = fVar53;
      auVar72._0_4_ = fVar53;
      auVar72._8_4_ = fVar53;
      auVar72._12_4_ = fVar53;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar29 + -0x10 + lVar24)));
      auVar39 = vmulss_avx512f(auVar67,auVar44);
      auVar39._4_4_ = auVar39._0_4_;
      auVar39._8_4_ = auVar39._0_4_;
      auVar39._12_4_ = auVar39._0_4_;
      auVar40 = vfmsub231ps_fma(auVar39,auVar72,auVar45);
      fVar52 = fVar51 * fVar52;
      auVar47._4_4_ = fVar52;
      auVar47._0_4_ = fVar52;
      auVar47._8_4_ = fVar52;
      auVar47._12_4_ = fVar52;
      auVar45 = vfmsub231ps_avx512vl(auVar47,auVar44,auVar62);
      fVar53 = fVar53 * fVar50;
      auVar42._4_4_ = fVar53;
      auVar42._0_4_ = fVar53;
      auVar42._8_4_ = fVar53;
      auVar42._12_4_ = fVar53;
      aVar11 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmsub231ps_fma(auVar42,auVar61,auVar67);
      auVar35 = vsubps_avx(auVar46,*(undefined1 (*) [16])ray);
      auVar36 = vsubps_avx(auVar56,*(undefined1 (*) [16])(ray + 0x10));
      auVar37 = vsubps_avx(auVar58,*(undefined1 (*) [16])(ray + 0x20));
      auVar39 = *(undefined1 (*) [16])(ray + 0x40);
      auVar47 = *(undefined1 (*) [16])(ray + 0x50);
      auVar38 = *(undefined1 (*) [16])(ray + 0x60);
      auVar41 = vmulps_avx512vl(auVar47,auVar37);
      auVar41 = vfmsub231ps_fma(auVar41,auVar36,auVar38);
      auVar70._0_4_ = auVar38._0_4_ * auVar35._0_4_;
      auVar70._4_4_ = auVar38._4_4_ * auVar35._4_4_;
      auVar70._8_4_ = auVar38._8_4_ * auVar35._8_4_;
      auVar70._12_4_ = auVar38._12_4_ * auVar35._12_4_;
      auVar42 = vfmsub231ps_fma(auVar70,auVar37,auVar39);
      auVar71._0_4_ = auVar39._0_4_ * auVar36._0_4_;
      auVar71._4_4_ = auVar39._4_4_ * auVar36._4_4_;
      auVar71._8_4_ = auVar39._8_4_ * auVar36._8_4_;
      auVar71._12_4_ = auVar39._12_4_ * auVar36._12_4_;
      auVar46 = vfmsub231ps_avx512vl(auVar71,auVar35,auVar47);
      auVar59._0_4_ = aVar11.v[0] * auVar38._0_4_;
      auVar59._4_4_ = aVar11.v[1] * auVar38._4_4_;
      auVar59._8_4_ = aVar11.v[2] * auVar38._8_4_;
      auVar59._12_4_ = aVar11.v[3] * auVar38._12_4_;
      auVar47 = vfmadd231ps_avx512vl(auVar59,auVar45,auVar47);
      auVar39 = vfmadd231ps_fma(auVar47,auVar40,auVar39);
      auVar38 = vandps_avx512vl(auVar39,auVar74._0_16_);
      auVar47 = vmulps_avx512vl(auVar44,auVar46);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar42,auVar72);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar41,auVar61);
      auVar47 = vxorps_avx512vl(auVar38,auVar47);
      auVar44 = auVar75._0_16_;
      uVar8 = vcmpps_avx512vl(auVar47,auVar44,5);
      bVar20 = (byte)uVar8 & bVar30;
      if (bVar20 == 0) {
LAB_01d6d85f:
        bVar20 = 0;
      }
      else {
        auVar69._0_4_ = fVar51 * auVar46._0_4_;
        auVar69._4_4_ = fVar51 * auVar46._4_4_;
        auVar69._8_4_ = fVar51 * auVar46._8_4_;
        auVar69._12_4_ = fVar51 * auVar46._12_4_;
        auVar42 = vfmadd213ps_fma(auVar42,auVar67,auVar69);
        auVar41 = vfmadd213ps_fma(auVar41,auVar62,auVar42);
        auVar63._0_4_ = auVar38._0_4_ ^ auVar41._0_4_;
        auVar63._4_4_ = auVar38._4_4_ ^ auVar41._4_4_;
        auVar63._8_4_ = auVar38._8_4_ ^ auVar41._8_4_;
        auVar63._12_4_ = auVar38._12_4_ ^ auVar41._12_4_;
        uVar8 = vcmpps_avx512vl(auVar63,auVar44,5);
        bVar20 = bVar20 & (byte)uVar8;
        if (bVar20 == 0) goto LAB_01d6d85f;
        auVar16._8_4_ = 0x7fffffff;
        auVar16._0_8_ = 0x7fffffff7fffffff;
        auVar16._12_4_ = 0x7fffffff;
        auVar42 = vandps_avx512vl(auVar39,auVar16);
        auVar41 = vsubps_avx(auVar42,auVar47);
        uVar8 = vcmpps_avx512vl(auVar41,auVar63,5);
        bVar20 = bVar20 & (byte)uVar8;
        if (bVar20 == 0) goto LAB_01d6d85f;
        auVar65._0_4_ = auVar37._0_4_ * aVar11.v[0];
        auVar65._4_4_ = auVar37._4_4_ * aVar11.v[1];
        auVar65._8_4_ = auVar37._8_4_ * aVar11.v[2];
        auVar65._12_4_ = auVar37._12_4_ * aVar11.v[3];
        auVar36 = vfmadd213ps_fma(auVar36,auVar45,auVar65);
        auVar35 = vfmadd213ps_fma(auVar35,auVar40,auVar36);
        auVar57._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x30);
        auVar57._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x34);
        auVar57._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x38);
        auVar57._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x3c);
        auVar54._0_4_ = auVar38._0_4_ ^ auVar35._0_4_;
        auVar54._4_4_ = auVar38._4_4_ ^ auVar35._4_4_;
        auVar54._8_4_ = auVar38._8_4_ ^ auVar35._8_4_;
        auVar54._12_4_ = auVar38._12_4_ ^ auVar35._12_4_;
        auVar66._0_4_ = auVar42._0_4_ * *(float *)(ray + 0x80);
        auVar66._4_4_ = auVar42._4_4_ * *(float *)(ray + 0x84);
        auVar66._8_4_ = auVar42._8_4_ * *(float *)(ray + 0x88);
        auVar66._12_4_ = auVar42._12_4_ * *(float *)(ray + 0x8c);
        uVar8 = vcmpps_avx512vl(auVar54,auVar66,2);
        uVar10 = vcmpps_avx512vl(auVar57,auVar54,1);
        bVar20 = bVar20 & (byte)uVar8 & (byte)uVar10;
        if (bVar20 == 0) {
LAB_01d6dd67:
          bVar20 = 0;
          aVar11 = local_3748;
          auVar45 = local_3738;
          auVar40 = local_3728;
          auVar42 = local_3718;
          auVar54 = _local_3708;
          auVar63 = _local_36f8;
          auVar47 = _local_36e8;
        }
        else {
          uVar8 = vcmpps_avx512vl(auVar39,ZEXT816(0) << 0x20,4);
          bVar20 = bVar20 & (byte)uVar8;
          if (bVar20 == 0) goto LAB_01d6dd67;
        }
        _local_36e8 = auVar47;
        _local_36f8 = auVar63;
        _local_3708 = auVar54;
        local_3718 = auVar42;
        local_3728 = auVar40;
        local_3738 = auVar45;
        local_3748 = aVar11;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar73 = ZEXT1664(auVar39);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar74 = ZEXT1664(auVar39);
        auVar39 = vxorps_avx512vl(auVar44,auVar44);
        auVar75 = ZEXT1664(auVar39);
      }
      auVar39 = auVar75._0_16_;
      pGVar5 = (context->scene->geometries).items[*(uint *)(lVar29 + lVar24)].ptr;
      uVar2 = pGVar5->mask;
      auVar44._4_4_ = uVar2;
      auVar44._0_4_ = uVar2;
      auVar44._8_4_ = uVar2;
      auVar44._12_4_ = uVar2;
      uVar8 = vptestmd_avx512vl(auVar44,*(undefined1 (*) [16])(ray + 0x90));
      bVar20 = (byte)uVar8 & 0xf & bVar20;
      uVar34 = (ulong)bVar20;
      if (bVar20 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar47 = vrcp14ps_avx512vl(local_3718);
          auVar15._8_4_ = 0x3f800000;
          auVar15._0_8_ = 0x3f8000003f800000;
          auVar15._12_4_ = 0x3f800000;
          auVar38 = vfnmadd213ps_avx512vl(auVar47,local_3718,auVar15);
          auVar47 = vfmadd132ps_fma(auVar38,auVar47,auVar47);
          fVar50 = auVar47._0_4_;
          fVar51 = auVar47._4_4_;
          fVar52 = auVar47._8_4_;
          fVar53 = auVar47._12_4_;
          local_3598._0_8_ = local_3728._0_8_;
          local_3598._8_8_ = local_3728._8_8_;
          local_3598._16_8_ = local_3738._0_8_;
          local_3598._24_8_ = local_3738._8_8_;
          local_3598.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_3748;
          local_3568 = CONCAT44(fVar51 * (float)local_3708._4_4_,fVar50 * (float)local_3708._0_4_);
          uStack_3560 = CONCAT44(fVar53 * fStack_36fc,fVar52 * fStack_3700);
          local_3558._4_4_ = fVar51 * (float)local_36f8._4_4_;
          local_3558._0_4_ = fVar50 * (float)local_36f8._0_4_;
          fStack_3550 = fVar52 * fStack_36f0;
          fStack_354c = fVar53 * fStack_36ec;
          local_3548._4_4_ = fVar51 * (float)local_36e8._4_4_;
          local_3548._0_4_ = fVar50 * (float)local_36e8._0_4_;
          fStack_3540 = fVar52 * fStack_36e0;
          fStack_353c = fVar53 * fStack_36dc;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_3598.field_0);
          local_3538 = vpbroadcastd_avx512vl();
          _local_3548 = vpbroadcastd_avx512vl();
          local_3598._0_8_ = Ng.field_0._0_8_;
          local_3598._8_8_ = Ng.field_0._8_8_;
          local_3598._16_8_ = Ng.field_0._16_8_;
          local_3598._24_8_ = Ng.field_0._24_8_;
          local_3568 = u.field_0._0_8_;
          uStack_3560 = u.field_0._8_8_;
          _local_3558 = v.field_0;
          vpcmpeqd_avx2(ZEXT1632(local_3538),ZEXT1632(local_3538));
          uStack_3524 = context->user->instID[0];
          local_3528 = uStack_3524;
          uStack_3520 = uStack_3524;
          uStack_351c = uStack_3524;
          uStack_3518 = context->user->instPrimID[0];
          uStack_3514 = uStack_3518;
          uStack_3510 = uStack_3518;
          uStack_350c = uStack_3518;
          auVar47 = *(undefined1 (*) [16])(ray + 0x80);
          auVar38 = vblendmps_avx512vl(auVar47,(undefined1  [16])t.field_0);
          bVar19 = (bool)(bVar20 >> 1 & 1);
          bVar7 = (bool)(bVar20 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar20 & 1) * auVar38._0_4_ | !(bool)(bVar20 & 1) * uStack_3518;
          *(uint *)(ray + 0x84) = (uint)bVar19 * auVar38._4_4_ | !bVar19 * uStack_3518;
          *(uint *)(ray + 0x88) = (uint)bVar7 * auVar38._8_4_ | !bVar7 * uStack_3518;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar20 >> 3) * auVar38._12_4_ | !(bool)(bVar20 >> 3) * uStack_3518;
          local_3778 = vpmovm2d_avx512vl(uVar34);
          args.valid = (int *)local_3778;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3598;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          uVar34 = vptestmd_avx512vl(local_3778,local_3778);
          if ((uVar34 & 0xf) == 0) {
            uVar34 = 0;
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar73 = ZEXT1664(auVar38);
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar74 = ZEXT1664(auVar38);
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            auVar75 = ZEXT1664(auVar39);
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar73 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar74 = ZEXT1664(auVar38);
              auVar39 = vxorps_avx512vl(auVar39,auVar39);
              auVar75 = ZEXT1664(auVar39);
            }
            else {
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar73 = ZEXT1664(auVar38);
              auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar74 = ZEXT1664(auVar38);
              auVar39 = vxorps_avx512vl(auVar39,auVar39);
              auVar75 = ZEXT1664(auVar39);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar39 = vxorps_avx512vl(auVar39,auVar39);
                auVar75 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar74 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar73 = ZEXT1664(auVar39);
              }
            }
            uVar34 = vptestmd_avx512vl(local_3778,local_3778);
            uVar34 = uVar34 & 0xf;
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar19 = (bool)((byte)uVar34 & 1);
            auVar48._0_4_ = (uint)bVar19 * auVar39._0_4_ | (uint)!bVar19 * *(int *)(args.ray + 0x80)
            ;
            bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * *(int *)(args.ray + 0x84)
            ;
            bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * *(int *)(args.ray + 0x88)
            ;
            bVar19 = SUB81(uVar34 >> 3,0);
            auVar48._12_4_ =
                 (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
          }
          bVar19 = (bool)((byte)uVar34 & 1);
          auVar49._0_4_ = (uint)bVar19 * *(int *)pRVar1 | (uint)!bVar19 * auVar47._0_4_;
          bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
          auVar49._4_4_ = (uint)bVar19 * *(int *)(ray + 0x84) | (uint)!bVar19 * auVar47._4_4_;
          bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
          auVar49._8_4_ = (uint)bVar19 * *(int *)(ray + 0x88) | (uint)!bVar19 * auVar47._8_4_;
          bVar19 = SUB81(uVar34 >> 3,0);
          auVar49._12_4_ = (uint)bVar19 * *(int *)(ray + 0x8c) | (uint)!bVar19 * auVar47._12_4_;
          *(undefined1 (*) [16])pRVar1 = auVar49;
        }
        bVar30 = ((byte)uVar34 ^ 0xf) & bVar30;
      }
      lVar24 = lVar24 + 4;
    } while (bVar30 != 0);
    bVar30 = 0;
LAB_01d6dd71:
    lVar22 = lVar22 + 1;
    lVar29 = lVar29 + 0xb0;
    bVar23 = bVar23 & bVar30;
  } while (bVar23 != 0);
  bVar23 = 0;
LAB_01d6dd8a:
  bVar23 = ~bVar23 & 0xf | (byte)local_380c;
  local_380c = (uint)bVar23;
  if (bVar23 == 0xf) {
    local_380c._0_1_ = 0xf;
    goto LAB_01d6ddc7;
  }
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar23 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar23 & 1) * tray.tfar.field_0.i[0];
  bVar19 = (bool)(bVar23 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar19 * auVar39._4_4_ | (uint)!bVar19 * tray.tfar.field_0.i[1];
  bVar19 = (bool)(bVar23 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar19 * auVar39._8_4_ | (uint)!bVar19 * tray.tfar.field_0.i[2];
  bVar19 = (bool)(bVar23 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar19 * auVar39._12_4_ | (uint)!bVar19 * tray.tfar.field_0.i[3];
  goto LAB_01d6d43d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }